

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_folding.cpp
# Opt level: O0

void skiwi::anon_unknown_26::fold_fixnum_to_flonum(PrimitiveCall *p,Expression *e)

{
  bool bVar1;
  size_type sVar2;
  reference e_00;
  Flonum local_120;
  undefined1 local_c8 [8];
  Fixnum f1;
  Literal lit1;
  Expression *e_local;
  PrimitiveCall *p_local;
  
  sVar2 = std::
          vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
          ::size(&p->arguments);
  if (sVar2 != 1) {
    __assert_fail("p.arguments.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/constant_folding.cpp"
                  ,0x4f5,
                  "void skiwi::(anonymous namespace)::fold_fixnum_to_flonum(PrimitiveCall &, Expression &)"
                 );
  }
  std::
  variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
  ::variant((variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
             *)((long)&f1.filename.field_2 + 8));
  Fixnum::Fixnum((Fixnum *)local_c8);
  e_00 = std::
         vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
         ::operator[](&p->arguments,0);
  bVar1 = is_literal((Literal *)((long)&f1.filename.field_2 + 8),e_00);
  if ((bVar1) &&
     (bVar1 = is_fixnum((Fixnum *)local_c8,(Literal *)((long)&f1.filename.field_2 + 8)), bVar1)) {
    make_flonum(&local_120,(double)(long)f1._0_8_);
    std::
    variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
    ::operator=((variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                 *)e,&local_120);
    Flonum::~Flonum(&local_120);
  }
  Fixnum::~Fixnum((Fixnum *)local_c8);
  std::
  variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
  ::~variant((variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
              *)((long)&f1.filename.field_2 + 8));
  return;
}

Assistant:

void fold_fixnum_to_flonum(PrimitiveCall& p, Expression& e)
    {
    assert(p.arguments.size() == 1);
    Literal lit1;
    Fixnum f1;
    if (is_literal(lit1, p.arguments[0]))
      {
      if (is_fixnum(f1, lit1))
        {
        e = make_flonum((double)f1.value);
        }
      }
    }